

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawenc.c
# Opt level: O0

void raw_write_image_file_or_md5
               (aom_image_t *img,int *planes,int num_planes,void *file_or_md5,WRITER writer_func)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  aom_image_t *in_RCX;
  int in_EDX;
  long in_RSI;
  aom_image_t *in_RDI;
  code *in_R8;
  bool bVar4;
  int y;
  int stride;
  uchar *buf;
  int h;
  int w;
  int plane;
  int i;
  int bytes_per_sample;
  _Bool high_bitdepth;
  int local_50;
  uchar *local_48;
  int iVar5;
  int iVar6;
  undefined3 in_stack_ffffffffffffffd4;
  undefined4 uVar7;
  
  bVar4 = (in_RDI->fmt & 0x800) != AOM_IMG_FMT_NONE;
  uVar7 = CONCAT13(bVar4,in_stack_ffffffffffffffd4);
  uVar1 = 1;
  if (bVar4) {
    uVar1 = 2;
  }
  for (iVar6 = 0; iVar6 < in_EDX; iVar6 = iVar6 + 1) {
    iVar5 = *(int *)(in_RSI + (long)iVar6 * 4);
    iVar2 = aom_img_plane_width(in_RDI,iVar5);
    iVar3 = aom_img_plane_height(in_RDI,iVar5);
    if ((in_RDI->monochrome == 0) || (iVar5 == 0)) {
      local_48 = in_RDI->planes[iVar5];
      iVar5 = in_RDI->stride[iVar5];
      for (local_50 = 0; local_50 < iVar3; local_50 = local_50 + 1) {
        (*in_R8)(in_RCX,local_48,uVar1,iVar2);
        local_48 = local_48 + iVar5;
      }
    }
    else {
      write_greyscale(in_RCX,(int)((ulong)in_R8 >> 0x20),(WRITER)CONCAT44(uVar7,uVar1),
                      (void *)CONCAT44(iVar6,iVar5));
    }
  }
  return;
}

Assistant:

static void raw_write_image_file_or_md5(const aom_image_t *img,
                                        const int *planes, const int num_planes,
                                        void *file_or_md5, WRITER writer_func) {
  const bool high_bitdepth = img->fmt & AOM_IMG_FMT_HIGHBITDEPTH;
  const int bytes_per_sample = high_bitdepth ? 2 : 1;
  for (int i = 0; i < num_planes; ++i) {
    const int plane = planes[i];
    const int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    // If we're on a color plane and the output is monochrome, write a greyscale
    // value. Since there are only YUV planes, compare against Y.
    if (img->monochrome && plane != AOM_PLANE_Y) {
      write_greyscale(img, w * h, writer_func, file_or_md5);
      continue;
    }
    const unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    for (int y = 0; y < h; ++y) {
      writer_func(file_or_md5, buf, bytes_per_sample, w);
      buf += stride;
    }
  }
}